

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_Foo_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *buf_00;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 == 0x496e506172656e74) {
    uVar1 = flatcc_json_parser_symbol_part(buf + 8,end);
    if (uVar1 != 0x4e616d6573706163) {
      return buf;
    }
    buf_00 = buf + 0x10;
    uVar1 = flatcc_json_parser_symbol_part(buf_00,end);
    if ((uVar1 & 0xff00000000000000) != 0x6500000000000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf_00,end,1,aggregate);
    if (end_local == buf_00) {
      return buf;
    }
    *value = 1;
    *value_sign = 0;
  }
  else {
    if ((uVar1 & 0xffffffff00000000) != 0x4e4f4e4500000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0;
    *value_sign = 0;
  }
  return end_local;
}

Assistant:

static const char *MyGame_Example_Foo_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w == 0x496e506172656e74) { /* descend "InParent" */
        buf += 8;
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x4e616d6573706163) { /* descend "Namespac" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if ((w & 0xff00000000000000) == 0x6500000000000000) { /* "e" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 1, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "e" */
                return unmatched;
            } /* "e" */
        } else { /* descend "Namespac" */
            return unmatched;
        } /* descend "Namespac" */
    } else { /* descend "InParent" */
        if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(0), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "NONE" */
            return unmatched;
        } /* "NONE" */
    } /* descend "InParent" */
    return buf;
}